

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O0

void Sim_UtilSimulate(Sim_Man_t *p,int fType)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int local_24;
  int i;
  Abc_Obj_t *pNode;
  int fType_local;
  Sim_Man_t *p_local;
  
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->pNtk->vObjs), local_24 < iVar1; local_24 = local_24 + 1)
  {
    pAVar2 = Abc_NtkObj(p->pNtk,local_24);
    if ((pAVar2 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar2), iVar1 != 0)) {
      Sim_UtilSimulateNode(p,pAVar2,fType,fType,fType);
    }
  }
  for (local_24 = 0; iVar1 = Abc_NtkCoNum(p->pNtk), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar2 = Abc_NtkCo(p->pNtk,local_24);
    Sim_UtilSimulateNode(p,pAVar2,fType,fType,fType);
  }
  return;
}

Assistant:

void Sim_UtilSimulate( Sim_Man_t * p, int fType )
{
    Abc_Obj_t * pNode;
    int i;
    // simulate the internal nodes
    Abc_NtkForEachNode( p->pNtk, pNode, i )
        Sim_UtilSimulateNode( p, pNode, fType, fType, fType );
    // assign simulation info of the CO nodes
    Abc_NtkForEachCo( p->pNtk, pNode, i )
        Sim_UtilSimulateNode( p, pNode, fType, fType, fType );
}